

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O1

int cfg_tobin_strptr(void *reference,size_t bin_size,const_strarray *value)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  if (bin_size == 8) {
    if (*reference != (void *)0x0) {
      free(*reference);
    }
    pcVar2 = strdup(value->value);
    *(char **)reference = pcVar2;
    iVar1 = -(uint)(pcVar2 == (char *)0x0);
  }
  return iVar1;
}

Assistant:

int
cfg_tobin_strptr(void *reference, size_t bin_size, const struct const_strarray *value) {
  char **ptr;

  if (bin_size != sizeof(*ptr)) {
    return -1;
  }

  ptr = (char **)reference;
  if (*ptr) {
    free(*ptr);
  }

  *ptr = strdup(strarray_get_first_c(value));
  return *ptr == NULL ? -1 : 0;
}